

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O1

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessComputeShaderArguments
          (ConversionStream *this,iterator *TypeToken,
          vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
          *Params,String *GlobalVariables,String *Prologue)

{
  _List_node_base *p_Var1;
  char *pcVar2;
  _List_node_base *p_Var3;
  ShaderParameterInfo *pSVar4;
  pointer pSVar5;
  HLSL2GLSLConverterImpl *pHVar6;
  iterator __position;
  iterator *piVar7;
  int iVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  ostream *poVar10;
  size_t sVar11;
  __node_base_ptr p_Var12;
  undefined1 *puVar13;
  ConversionStream *pCVar14;
  _Hash_node_base *p_Var15;
  pointer pSVar16;
  string *psVar17;
  long *plVar18;
  bool bVar19;
  string err_4;
  Char *ExpectedLiteral;
  String GLSLVariable;
  vector<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>_>_>
  MemberItStack;
  String CSGroupSize [3];
  stringstream PrologueSS;
  stringstream GlobalVarsSS;
  String *in_stack_fffffffffffffb88;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_470;
  undefined1 local_468 [47];
  char local_439;
  ConversionStream *local_438;
  pointer local_430;
  vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
  local_428;
  String local_408;
  void *local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3e0;
  undefined8 uStack_3d0;
  string local_3c8;
  char *local_3a8;
  long local_3a0;
  char *local_388;
  long local_380;
  long local_378 [3];
  String *local_360;
  String *local_358;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  *local_350;
  iterator *local_348;
  stringstream local_340 [16];
  long local_330 [14];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  Args = Prologue;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__cxx11::stringstream::stringstream(local_340);
  local_470._M_node = TypeToken->_M_node->_M_prev;
  local_438 = this;
  if ((local_470._M_node ==
       (this->m_Tokens).
       super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
       ._M_impl._M_node.super__List_node_base._M_next) ||
     (*(int *)&local_470._M_node[1]._M_next != 0x138)) {
    FormatString<char[31]>(&local_3c8,(char (*) [31])"Missing numthreads declaration");
    in_stack_fffffffffffffb88 = (String *)local_468;
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (in_stack_fffffffffffffb88,local_438,&local_470,4);
    Args = &local_3c8;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessComputeShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xcac,Args,(char (*) [2])0x6e9945,in_stack_fffffffffffffb88);
    if ((pointer)local_468._0_8_ != (pointer)(local_468 + 0x10)) {
      operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
  }
  local_430 = (pointer)&local_438->m_Tokens;
  p_Var1 = (((TokenListType *)local_430)->
           super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  bVar19 = local_470._M_node == p_Var1;
  if (!bVar19) {
    iVar8 = *(int *)&local_470._M_node[1]._M_next;
    while (iVar8 != 0x137) {
      local_470._M_node = (local_470._M_node)->_M_prev;
      bVar19 = local_470._M_node == p_Var1;
      if (bVar19) goto LAB_002d87ec;
      iVar8 = *(int *)&local_470._M_node[1]._M_next;
    }
    if (!bVar19) goto LAB_002d8885;
  }
LAB_002d87ec:
  FormatString<char[33]>(&local_3c8,(char (*) [33])"Missing numthreads() declaration");
  in_stack_fffffffffffffb88 = (String *)local_468;
  PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
            (in_stack_fffffffffffffb88,local_438,&local_470,4);
  Args = &local_3c8;
  LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
            (false,"ProcessComputeShaderArguments",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
             ,0xcb2,Args,(char (*) [2])0x6e9945,in_stack_fffffffffffffb88);
  if ((pointer)local_468._0_8_ != (pointer)(local_468 + 0x10)) {
    operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
LAB_002d8885:
  __position._M_node = local_470._M_node;
  local_470._M_node = (local_470._M_node)->_M_next;
  local_350 = Params;
  if ((((pointer)local_470._M_node == local_430) || (*(int *)&local_470._M_node[1]._M_next != 0x13b)
      ) || (iVar8 = std::__cxx11::string::compare((char *)&local_470._M_node[1]._M_prev), iVar8 != 0
           )) {
    FormatString<char[33]>(&local_3c8,(char (*) [33])"Missing numthreads() declaration");
    in_stack_fffffffffffffb88 = (String *)local_468;
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (in_stack_fffffffffffffb88,local_438,&local_470,4);
    Args = &local_3c8;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessComputeShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xcb9,Args,(char (*) [2])0x6e9945,in_stack_fffffffffffffb88);
    if ((pointer)local_468._0_8_ != (pointer)(local_468 + 0x10)) {
      operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
  }
  local_470._M_node = (local_470._M_node)->_M_next;
  if (((pointer)local_470._M_node == local_430) || (*(int *)&local_470._M_node[1]._M_next != 0x135))
  {
    FormatString<char[29]>(&local_3c8,(char (*) [29])"Missing \'(\' after numthreads");
    in_stack_fffffffffffffb88 = (String *)local_468;
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (in_stack_fffffffffffffb88,local_438,&local_470,4);
    Args = &local_3c8;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessComputeShaderArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xcbf,Args,(char (*) [2])0x6e9945,in_stack_fffffffffffffb88);
    if ((pointer)local_468._0_8_ != (pointer)(local_468 + 0x10)) {
      operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
  }
  local_360 = Prologue;
  lVar9 = 0x10;
  do {
    puVar13 = (undefined1 *)((long)&local_3c8._M_dataplus._M_p + lVar9);
    *(undefined1 **)((long)&aStack_3e0 + lVar9 + 8) = puVar13;
    *(undefined8 *)((long)&uStack_3d0 + lVar9) = 0;
    *puVar13 = 0;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x70);
  psVar17 = &local_3c8;
  lVar9 = 0;
  pCVar14 = local_438;
  pSVar16 = local_430;
  local_358 = GlobalVariables;
  local_348 = TypeToken;
  do {
    local_470._M_node = (local_470._M_node)->_M_next;
    if (((pointer)local_470._M_node == pSVar16) ||
       (1 < *(int *)&local_470._M_node[1]._M_next - 0x13bU)) {
      FormatString<char[24],char_const*,char[11]>
                ((string *)local_468,(Diligent *)"Missing group size for ",
                 (char (*) [24])((long)ProcessComputeShaderArguments::DirNames + lVar9),
                 (char **)" direction",(char (*) [11])Args);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_408,pCVar14,&local_470,4);
      in_stack_fffffffffffffb88 = &local_408;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessComputeShaderArguments",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xcc9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_468,(char (*) [2])0x6e9945,&local_408);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p,
                        CONCAT71(local_408.field_2._1_7_,local_408.field_2._M_local_buf[0]) + 1);
      }
      if ((pointer)local_468._0_8_ != (pointer)(local_468 + 0x10)) {
        operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
      }
    }
    p_Var1 = local_470._M_node[1]._M_prev;
    pcVar2 = *(char **)((long)&local_3c8._M_string_length + lVar9 * 4);
    Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           strlen((char *)p_Var1);
    std::__cxx11::string::_M_replace((ulong)psVar17,0,pcVar2,(ulong)p_Var1);
    pSVar16 = local_430;
    pCVar14 = local_438;
    local_470._M_node = (local_470._M_node)->_M_next;
    local_428.
    super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x71254f;
    if (lVar9 == 0x10) {
      local_428.
      super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x752f31;
    }
    if (((pointer)local_470._M_node == local_430) ||
       (iVar8 = std::__cxx11::string::compare((char *)&local_470._M_node[1]._M_prev), iVar8 != 0)) {
      FormatString<char[10],char_const*,char[9],char_const*,char[11]>
                ((string *)local_468,(Diligent *)"Missing \'",(char (*) [10])&local_428,
                 (char **)"\' after ",
                 (char (*) [9])((long)ProcessComputeShaderArguments::DirNames + lVar9),
                 (char **)" direction",(char (*) [11])in_stack_fffffffffffffb88);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_408,pCVar14,&local_470,4);
      Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468;
      in_stack_fffffffffffffb88 = &local_408;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessComputeShaderArguments",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xcd0,Args,(char (*) [2])0x6e9945,&local_408);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p,
                        CONCAT71(local_408.field_2._1_7_,local_408.field_2._M_local_buf[0]) + 1);
      }
      if ((pointer)local_468._0_8_ != (pointer)(local_468 + 0x10)) {
        operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
      }
    }
    piVar7 = local_348;
    lVar9 = lVar9 + 8;
    psVar17 = psVar17 + 1;
  } while (lVar9 != 0x18);
  std::__cxx11::string::_M_assign((string *)&local_348->_M_node[3]._M_prev);
  pSVar16 = local_430;
  p_Var1 = piVar7->_M_node;
  while (p_Var1 != __position._M_node) {
    p_Var3 = (__position._M_node)->_M_next;
    std::__cxx11::
    list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
    _M_erase((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
              *)pSVar16,__position);
    __position._M_node = p_Var3;
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"layout ( local_size_x = ",0x18);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,local_3c8._M_dataplus._M_p,local_3c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", local_size_y = ",0x11);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_3a8,local_3a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", local_size_z = ",0x11);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_388,local_380);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ) in;\n",7);
  pSVar16 = (local_350->
            super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_430 = (local_350->
              super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar16 != local_430) {
    do {
      if (pSVar16->storageQualifier == Out) {
        LogError<true,char[52]>
                  (false,"ProcessComputeShaderArguments",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0xcf6,(char (*) [52])"Output variables are not allowed in compute shaders");
      }
      else if (pSVar16->storageQualifier == In) {
        local_428.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (ShaderParameterInfo **)0x0;
        local_428.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (ShaderParameterInfo **)0x0;
        local_428.
        super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (ShaderParameterInfo **)0x0;
        aStack_3e0._8_8_ =
             (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
              *)0x0;
        local_3e8 = (void *)0x0;
        aStack_3e0._M_allocated_capacity = 0;
        local_468._0_8_ = pSVar16;
        std::
        vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
        ::
        _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                  ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                    *)&local_428,(iterator)0x0,(ShaderParameterInfo **)local_468);
        local_468._0_8_ =
             (pSVar16->members).
             super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        if (aStack_3e0._M_allocated_capacity == aStack_3e0._8_8_) {
          std::
          vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
          ::
          _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                    ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                      *)&local_3e8,(iterator)aStack_3e0._M_allocated_capacity,
                     (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                      *)local_468);
        }
        else {
          *(undefined8 *)aStack_3e0._M_allocated_capacity = local_468._0_8_;
          aStack_3e0._M_allocated_capacity = aStack_3e0._M_allocated_capacity + 8;
        }
        if (((pSVar16->storageQualifier != Ret) && ((pSVar16->GSAttribs).PrimType == Undefined)) &&
           ((pSVar16->HSAttribs).PatchType == Undefined)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"    ",4);
          pcVar2 = (pSVar16->Type)._M_dataplus._M_p;
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)local_330 + (int)*(undefined8 *)(local_330[0] + -0x18));
          }
          else {
            sVar11 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,pcVar2,sVar11);
          }
          local_468[0] = (string)0x20;
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_330,(char *)local_468,1);
          pcVar2 = (pSVar16->Name)._M_dataplus._M_p;
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
          }
          else {
            sVar11 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar2,sVar11);
          }
          if ((pSVar16->ArraySize)._M_string_length != 0) {
            local_468[0] = (string)0x5b;
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_330,(char *)local_468,1);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(pSVar16->ArraySize)._M_dataplus._M_p,
                                 (pSVar16->ArraySize)._M_string_length);
            local_468[0] = (string)0x5d;
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_468,1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,";\n",2);
        }
        while (local_428.
               super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_428.
               super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
          pSVar4 = local_428.
                   super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1];
          pSVar5 = (pSVar4->members).
                   super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((pSVar4->members).
              super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
              ._M_impl.super__Vector_impl_data._M_start == pSVar5) {
            if (((__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                  *)(aStack_3e0._M_allocated_capacity - 8))->_M_current != pSVar5) {
              FormatString<char[26],char[49]>
                        ((string *)local_468,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"MemberItStack.back() == CurrParam.members.cend()",
                         (char (*) [49])aStack_3e0._M_allocated_capacity);
              DebugAssertionFailed
                        ((Char *)local_468._0_8_,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb19);
              if ((pointer)local_468._0_8_ != (pointer)(local_468 + 0x10)) {
                operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
              }
            }
            if ((pSVar4->Semantic)._M_string_length == 0) {
              LogError<true,char[36],std::__cxx11::string,char[2]>
                        (false,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb1c,(char (*) [36])"No semantic assigned to parameter \"",&pSVar4->Name,
                         (char (*) [2])0x70aecf);
            }
            local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
            local_408._M_string_length = 0;
            local_408.field_2._M_local_buf[0] = '\0';
            pHVar6 = local_438->m_Converter;
            HashMapStringKey::HashMapStringKey
                      ((HashMapStringKey *)local_468,(pSVar4->Semantic)._M_dataplus._M_p,false);
            pCVar14 = (ConversionStream *)
                      ((local_468._8_8_ & 0x7fffffffffffffff) %
                      (pHVar6->m_HLSLSemanticToGLSLVar)._M_elems[5]._M_elems[0]._M_h._M_bucket_count
                      );
            p_Var12 = std::
                      _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::_M_find_before_node
                                ((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                  *)((pHVar6->m_HLSLSemanticToGLSLVar)._M_elems + 5),
                                 (size_type)pCVar14,(key_type *)local_468,
                                 local_468._8_8_ & 0x7fffffffffffffff);
            if (p_Var12 == (__node_base_ptr)0x0) {
              p_Var15 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var15 = p_Var12->_M_nxt;
            }
            if (((pointer)local_468._0_8_ != (pointer)0x0) && ((long)local_468._8_8_ < 0)) {
              operator_delete__((void *)local_468._0_8_);
            }
            if (p_Var15 != (_Hash_node_base *)0x0) {
              pCVar14 = (ConversionStream *)(p_Var15 + 3);
              std::__cxx11::string::_M_assign((string *)&local_408);
            }
            BuildParameterName_abi_cxx11_((string *)local_468,pCVar14,&local_428,'.',"","","");
            if (local_408._M_string_length == 0) {
              LogError<true,char[28],std::__cxx11::string,char[142]>
                        (false,"operator()",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xcee,(char (*) [28])"Unexpected input semantic \"",&pSVar4->Semantic,
                         (char (*) [142])
                         "\". The only allowed semantics for the compute shader inputs are \"SV_DispatchThreadID\", \"SV_GroupID\", \"SV_GroupThreadID\", and \"SV_GroupIndex\"."
                        );
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"    ",4);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_330,local_408._M_dataplus._M_p,
                                 local_408._M_string_length);
            local_439 = '(';
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,&local_439,1);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(pSVar4->Type)._M_dataplus._M_p,
                                 (pSVar4->Type)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(char *)local_468._0_8_,local_468._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,");\n",3);
            if ((pointer)local_468._0_8_ != (pointer)(local_468 + 0x10)) {
              operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
            }
            local_428.
            super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_428.
                 super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
            aStack_3e0._M_allocated_capacity = aStack_3e0._M_allocated_capacity - 8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_dataplus._M_p != &local_408.field_2) {
              operator_delete(local_408._M_dataplus._M_p,
                              CONCAT71(local_408.field_2._1_7_,local_408.field_2._M_local_buf[0]) +
                              1);
            }
          }
          else {
            if ((pSVar4->Semantic)._M_string_length != 0) {
              LogError<true,char[35],std::__cxx11::string,char[2]>
                        (false,"ProcessShaderArgument",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0xb2e,(char (*) [35])"Semantic assigned to a structure \"",&pSVar4->Name,
                         (char (*) [2])0x70aecf);
            }
            pSVar5 = ((__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                       *)(aStack_3e0._M_allocated_capacity - 8))->_M_current;
            if (pSVar5 == (pSVar4->members).
                          super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
              local_428.
              super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_428.
                   super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
              aStack_3e0._M_allocated_capacity =
                   (size_type)
                   (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                    *)(aStack_3e0._M_allocated_capacity - 8);
            }
            else {
              ((__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                *)(aStack_3e0._M_allocated_capacity - 8))->_M_current = pSVar5 + 1;
              if (local_428.
                  super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_428.
                  super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                local_468._0_8_ = pSVar5;
                std::
                vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                ::
                _M_realloc_insert<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>
                          ((vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*>>
                            *)&local_428,
                           (iterator)
                           local_428.
                           super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (ShaderParameterInfo **)local_468);
              }
              else {
                *local_428.
                 super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish = pSVar5;
                local_428.
                super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_428.
                     super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              local_468._0_8_ =
                   (pSVar5->members).
                   super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              if (aStack_3e0._M_allocated_capacity == aStack_3e0._8_8_) {
                std::
                vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                ::
                _M_realloc_insert<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>
                          ((vector<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>,std::allocator<__gnu_cxx::__normal_iterator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_const*,std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>>>>>
                            *)&local_3e8,(iterator)aStack_3e0._M_allocated_capacity,
                           (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                            *)local_468);
              }
              else {
                *(undefined8 *)aStack_3e0._M_allocated_capacity = local_468._0_8_;
                aStack_3e0._M_allocated_capacity =
                     (size_type)
                     (__normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>_>
                      *)(aStack_3e0._M_allocated_capacity + 8);
              }
            }
          }
        }
        if (local_3e8 != (void *)0x0) {
          operator_delete(local_3e8,aStack_3e0._8_8_ - (long)local_3e8);
        }
        if (local_428.
            super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (ShaderParameterInfo **)0x0) {
          operator_delete(local_428.
                          super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_428.
                                super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_428.
                                super__Vector_base<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      pSVar16 = pSVar16 + 1;
    } while (pSVar16 != local_430);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_358,(string *)local_468);
  if ((pointer)local_468._0_8_ != (pointer)(local_468 + 0x10)) {
    operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_360,(string *)local_468);
  if ((pointer)local_468._0_8_ != (pointer)(local_468 + 0x10)) {
    operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
  }
  lVar9 = -0x60;
  plVar18 = local_378;
  do {
    if (plVar18 != (long *)plVar18[-2]) {
      operator_delete((long *)plVar18[-2],*plVar18 + 1);
    }
    plVar18 = plVar18 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(aiStack_2c0);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessComputeShaderArguments(TokenListType::iterator&          TypeToken,
                                                                             std::vector<ShaderParameterInfo>& Params,
                                                                             String&                           GlobalVariables,
                                                                             String&                           Prologue)
{
    stringstream GlobalVarsSS, PrologueSS;

    auto Token = TypeToken;
    //[numthreads(16,16,1)]
    //void TestCS(uint3 DTid : SV_DispatchThreadID)
    //^
    --Token;
    //[numthreads(16,16,1)]
    //                    ^
    //void TestCS(uint3 DTid : SV_DispatchThreadID)
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.begin() && Token->Type == TokenType::ClosingSquareBracket, "Missing numthreads declaration");

    while (Token != m_Tokens.begin() && Token->Type != TokenType::OpenSquareBracket)
        --Token;
    //[numthreads(16,16,1)]
    //^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.begin(), "Missing numthreads() declaration");
    auto OpenStapleToken = Token;

    ++Token;
    //[numthreads(16,16,1)]
    // ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end() && Token->Type == TokenType::Identifier && Token->Literal == "numthreads",
                        "Missing numthreads() declaration");

    ++Token;
    //[numthreads(16,16,1)]
    //           ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end() && Token->Type == TokenType::OpenParen,
                        "Missing \'(\' after numthreads");

    String             CSGroupSize[3] = {};
    static const Char* DirNames[]     = {"X", "Y", "Z"};
    for (int i = 0; i < 3; ++i)
    {
        ++Token;
        //[numthreads(16,16,1)]
        //            ^
        VERIFY_PARSER_STATE(Token, Token != m_Tokens.end() && (Token->Type == TokenType::NumericConstant || Token->Type == TokenType::Identifier),
                            "Missing group size for ", DirNames[i], " direction");
        CSGroupSize[i] = Token->Literal.c_str();
        ++Token;
        //[numthreads(16,16,1)]
        //              ^    ^
        const Char* ExpectedLiteral = (i < 2) ? "," : ")";
        VERIFY_PARSER_STATE(Token, Token != m_Tokens.end() && Token->Literal == ExpectedLiteral,
                            "Missing \'", ExpectedLiteral, "\' after ", DirNames[i], " direction");
    }

    //OpenStapleToken
    //V
    //[numthreads(16,16,1)]
    //void TestCS(uint3 DTid : SV_DispatchThreadID)
    //^
    //TypeToken
    TypeToken->Delimiter = OpenStapleToken->Delimiter;
    m_Tokens.erase(OpenStapleToken, TypeToken);
    //
    // void TestCS(uint3 DTid : SV_DispatchThreadID)

    GlobalVarsSS << "layout ( local_size_x = " << CSGroupSize[0]
                 << ", local_size_y = " << CSGroupSize[1] << ", local_size_z = " << CSGroupSize[2] << " ) in;\n";

    for (const auto& Param : Params)
    {
        if (Param.storageQualifier == ShaderParameterInfo::StorageQualifier::In)
        {
            ProcessShaderArgument(
                Param, CSInd, InVar, PrologueSS,
                [&](const std::vector<const ShaderParameterInfo*>& MemberStack, const ShaderParameterInfo& Param, const String& Getter) //
                {
                    String FullParamName = BuildParameterName(MemberStack, '.');
                    if (Getter.empty())
                    {
                        LOG_ERROR_AND_THROW("Unexpected input semantic \"", Param.Semantic,
                                            "\". The only allowed semantics for the compute shader inputs are \"SV_DispatchThreadID\", "
                                            "\"SV_GroupID\", \"SV_GroupThreadID\", and \"SV_GroupIndex\".");
                    }
                    PrologueSS << "    " << Getter << '(' << Param.Type << "," << FullParamName << ");\n";
                } //
            );
        }
        else if (Param.storageQualifier == ShaderParameterInfo::StorageQualifier::Out)
        {
            LOG_ERROR_AND_THROW("Output variables are not allowed in compute shaders");
        }
    }

    GlobalVariables = GlobalVarsSS.str();
    Prologue        = PrologueSS.str();
}